

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headers.c
# Opt level: O2

curl_header * curl_easy_nextheader(CURL *easy,uint type,int request,curl_header *prev)

{
  char *pcVar1;
  int iVar2;
  Curl_llist_node *n;
  void *pvVar3;
  Curl_llist_node *n_00;
  void *pvVar4;
  int iVar5;
  size_t sVar6;
  curl_header *h;
  size_t sVar7;
  
  iVar5 = (easy->state).requests;
  if (request <= iVar5) {
    if (request != -1) {
      iVar5 = request;
    }
    if (prev == (curl_header *)0x0) {
      n = Curl_llist_head(&(easy->state).httphdrs);
    }
    else {
      if ((Curl_llist_node *)prev->anchor == (Curl_llist_node *)0x0) {
        return (curl_header *)0x0;
      }
      n = Curl_node_next((Curl_llist_node *)prev->anchor);
    }
    if (n != (Curl_llist_node *)0x0) {
      while ((pvVar3 = Curl_node_elem(n), (*(byte *)((long)pvVar3 + 0x34) & type) == 0 ||
             (*(int *)((long)pvVar3 + 0x30) != iVar5))) {
        n = Curl_node_next(n);
        if (n == (Curl_llist_node *)0x0) {
          return (curl_header *)0x0;
        }
      }
      pvVar3 = Curl_node_elem(n);
      n_00 = Curl_llist_head(&(easy->state).httphdrs);
      sVar7 = 0;
      sVar6 = 0;
      for (; n_00 != (Curl_llist_node *)0x0; n_00 = Curl_node_next(n_00)) {
        pvVar4 = Curl_node_elem(n_00);
        iVar2 = curl_strequal(*(char **)((long)pvVar3 + 0x20),*(char **)((long)pvVar4 + 0x20));
        if ((iVar2 != 0) && (*(int *)((long)pvVar4 + 0x30) == iVar5)) {
          sVar7 = (sVar7 + 1) - (ulong)((*(byte *)((long)pvVar4 + 0x34) & type) == 0);
        }
        if (n_00 == n) {
          sVar6 = sVar7 - 1;
        }
      }
      pcVar1 = *(char **)((long)pvVar3 + 0x28);
      (easy->state).headerout[1].name = *(char **)((long)pvVar3 + 0x20);
      (easy->state).headerout[1].value = pcVar1;
      (easy->state).headerout[1].amount = sVar7;
      (easy->state).headerout[1].index = sVar6;
      (easy->state).headerout[1].origin = *(byte *)((long)pvVar3 + 0x34) | 0x8000000;
      (easy->state).headerout[1].anchor = n;
      return (easy->state).headerout + 1;
    }
  }
  return (curl_header *)0x0;
}

Assistant:

struct curl_header *curl_easy_nextheader(CURL *easy,
                                         unsigned int type,
                                         int request,
                                         struct curl_header *prev)
{
  struct Curl_easy *data = easy;
  struct Curl_llist_node *pick;
  struct Curl_llist_node *e;
  struct Curl_header_store *hs;
  size_t amount = 0;
  size_t index = 0;

  if(request > data->state.requests)
    return NULL;
  if(request == -1)
    request = data->state.requests;

  if(prev) {
    pick = prev->anchor;
    if(!pick)
      /* something is wrong */
      return NULL;
    pick = Curl_node_next(pick);
  }
  else
    pick = Curl_llist_head(&data->state.httphdrs);

  if(pick) {
    /* make sure it is the next header of the desired type */
    do {
      hs = Curl_node_elem(pick);
      if((hs->type & type) && (hs->request == request))
        break;
      pick = Curl_node_next(pick);
    } while(pick);
  }

  if(!pick)
    /* no more headers available */
    return NULL;

  hs = Curl_node_elem(pick);

  /* count number of occurrences of this name within the mask and figure out
     the index for the currently selected entry */
  for(e = Curl_llist_head(&data->state.httphdrs); e; e = Curl_node_next(e)) {
    struct Curl_header_store *check = Curl_node_elem(e);
    if(strcasecompare(hs->name, check->name) &&
       (check->request == request) &&
       (check->type & type))
      amount++;
    if(e == pick)
      index = amount - 1;
  }

  copy_header_external(hs, index, amount, pick,
                       &data->state.headerout[1]);
  return &data->state.headerout[1];
}